

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QList<QCss::Declaration> * __thiscall
QCss::StyleSelector::declarationsForNode
          (QList<QCss::Declaration> *__return_storage_ptr__,StyleSelector *this,NodePtr node,
          char *extraPseudo)

{
  Selector *this_00;
  BasicSelector *pBVar1;
  Pseudo *pPVar2;
  Declaration *b;
  long lVar3;
  char cVar4;
  long lVar5;
  quint64 qVar6;
  undefined1 *puVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  QArrayData *pQVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QLatin1String QVar12;
  QArrayDataPointer<QCss::StyleRule> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Declaration *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  styleRulesForNode((QList<QCss::StyleRule> *)&local_58,this,node);
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    puVar7 = (undefined1 *)0x0;
    do {
      this_00 = local_58.ptr[(long)puVar7].selectors.d.ptr;
      pBVar1 = (this_00->basicSelectors).d.ptr;
      lVar5 = (this_00->basicSelectors).d.size;
      if ((pBVar1[lVar5 + -1].pseudos.d.size == 0) ||
         (pPVar2 = pBVar1[lVar5 + -1].pseudos.d.ptr, pPVar2->type != 0)) {
        qVar9 = 0;
        pcVar8 = (char16_t *)0x0;
LAB_005e0f9e:
        pQVar10 = (QArrayData *)0x0;
      }
      else {
        pQVar10 = &((pPVar2->name).d.d)->super_QArrayData;
        pcVar8 = (pPVar2->name).d.ptr;
        qVar9 = (pPVar2->name).d.size;
        if (pQVar10 == (QArrayData *)0x0) goto LAB_005e0f9e;
        LOCK();
        (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&pQVar10->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (extraPseudo == (char *)0x0) {
LAB_005e0fd0:
        if ((qVar9 == 0) &&
           ((qVar6 = Selector::pseudoClass(this_00,(quint64 *)0x0), qVar6 == 0x100 || (qVar6 == 1)))
           ) goto LAB_005e0fed;
      }
      else {
        lVar5 = -1;
        do {
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (extraPseudo[lVar3] != '\0');
        if ((qVar9 != lVar5) ||
           (QVar11.m_data = pcVar8, QVar11.m_size = qVar9, QVar12.m_data = extraPseudo,
           QVar12.m_size = qVar9, cVar4 = QtPrivate::equalStrings(QVar11,QVar12), cVar4 == '\0'))
        goto LAB_005e0fd0;
LAB_005e0fed:
        b = local_58.ptr[(long)puVar7].declarations.d.ptr;
        QtPrivate::QCommonArrayOps<QCss::Declaration>::growAppend
                  ((QCommonArrayOps<QCss::Declaration> *)__return_storage_ptr__,b,
                   b + local_58.ptr[(long)puVar7].declarations.d.size);
      }
      if (pQVar10 != (QArrayData *)0x0) {
        LOCK();
        (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar10->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar10->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar10,2,0x10);
        }
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 < (ulong)local_58.size);
  }
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Declaration> StyleSelector::declarationsForNode(NodePtr node, const char *extraPseudo)
{
    QList<Declaration> decls;
    QList<StyleRule> rules = styleRulesForNode(node);
    for (int i = 0; i < rules.size(); i++) {
        const Selector& selector = rules.at(i).selectors.at(0);
        const QString pseudoElement = selector.pseudoElement();

        if (extraPseudo && pseudoElement == QLatin1StringView(extraPseudo)) {
            decls += rules.at(i).declarations;
            continue;
        }

        if (!pseudoElement.isEmpty()) // skip rules with pseudo elements
            continue;
        quint64 pseudoClass = selector.pseudoClass();
        if (pseudoClass == PseudoClass_Enabled || pseudoClass == PseudoClass_Unspecified)
            decls += rules.at(i).declarations;
    }
    return decls;
}